

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

bool __thiscall QMainWindow::restoreState(QMainWindow *this,QByteArray *state,int version)

{
  bool bVar1;
  byte bVar2;
  Status SVar3;
  int in_EDX;
  long in_FS_OFFSET;
  bool restored;
  int v;
  int marker;
  QByteArray sd;
  QDataStream stream;
  undefined4 in_stack_ffffffffffffff78;
  OpenModeFlag in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  int iVar5;
  uint in_stack_ffffffffffffffbc;
  QByteArray local_40;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x5eaa0e);
  if (bVar1) {
    bVar2 = 0;
  }
  else {
    local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_40.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray
              ((QByteArray *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               (QByteArray *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
    QDataStream::QDataStream
              ((QDataStream *)&local_28,&local_40,
               (QFlags_conflict1 *)(ulong)in_stack_ffffffffffffffbc);
    QDataStream::setVersion((QDataStream *)&local_28,0xd);
    iVar5 = -0x55555556;
    iVar4 = -0x55555556;
    QDataStream::operator>>((QDataStream *)&local_28,(int *)&stack0xffffffffffffffb8);
    QDataStream::operator>>((QDataStream *)&local_28,(int *)&stack0xffffffffffffffb4);
    SVar3 = QDataStream::status((QDataStream *)&local_28);
    if (((SVar3 == Ok) && (iVar5 == 0xff)) && (iVar4 == in_EDX)) {
      d_func((QMainWindow *)0x5eab1c);
      QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eab2b);
      bVar2 = QMainWindowLayout::restoreState
                        ((QMainWindowLayout *)CONCAT44(in_stack_ffffffffffffffbc,iVar5),
                         (QDataStream *)CONCAT44(iVar4,in_stack_ffffffffffffffb0));
    }
    else {
      bVar2 = false;
    }
    QDataStream::~QDataStream((QDataStream *)&local_28);
    QByteArray::~QByteArray((QByteArray *)0x5eab64);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindow::restoreState(const QByteArray &state, int version)
{
    if (state.isEmpty())
        return false;
    QByteArray sd = state;
    QDataStream stream(&sd, QIODevice::ReadOnly);
    stream.setVersion(QDataStream::Qt_5_0);
    int marker, v;
    stream >> marker;
    stream >> v;
    if (stream.status() != QDataStream::Ok || marker != QMainWindowLayout::VersionMarker || v != version)
        return false;
    bool restored = d_func()->layout->restoreState(stream);
    return restored;
}